

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O3

void __thiscall avro::FixedSchema::FixedSchema(FixedSchema *this,int size,string *name)

{
  NodePtr *this_00;
  Node *pNVar1;
  Name local_70;
  
  pNVar1 = (Node *)operator_new(0x60);
  pNVar1->type_ = AVRO_FIXED;
  pNVar1->locked_ = false;
  pNVar1[1]._vptr_Node = (_func_int **)(pNVar1 + 2);
  pNVar1[1].type_ = AVRO_STRING;
  pNVar1[1].locked_ = false;
  *(undefined3 *)&pNVar1[1].field_0xd = 0;
  *(undefined1 *)&pNVar1[2]._vptr_Node = 0;
  pNVar1[3]._vptr_Node = (_func_int **)(pNVar1 + 4);
  pNVar1[3].type_ = AVRO_STRING;
  pNVar1[3].locked_ = false;
  *(undefined3 *)&pNVar1[3].field_0xd = 0;
  *(undefined1 *)&pNVar1[4]._vptr_Node = 0;
  *(undefined4 *)((long)&pNVar1[5]._vptr_Node + 4) = 0;
  pNVar1->_vptr_Node = (_func_int **)&PTR__NodeImpl_00192208;
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_00193380;
  this_00 = &(this->super_Schema).node_;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::Node>(this_00,pNVar1);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_00193450;
  pNVar1 = (this->super_Schema).node_.px;
  Node::checkLock(pNVar1);
  (*pNVar1->_vptr_Node[0x14])(pNVar1,size);
  pNVar1 = this_00->px;
  Name::Name(&local_70,name);
  Node::checkLock(pNVar1);
  (*pNVar1->_vptr_Node[0x10])(pNVar1,&local_70);
  (*pNVar1->_vptr_Node[0x11])(pNVar1,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.simpleName_._M_dataplus._M_p != &local_70.simpleName_.field_2) {
    operator_delete(local_70.simpleName_._M_dataplus._M_p,
                    local_70.simpleName_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.ns_._M_dataplus._M_p != &local_70.ns_.field_2) {
    operator_delete(local_70.ns_._M_dataplus._M_p,local_70.ns_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FixedSchema::FixedSchema(int size, const std::string &name) :
    Schema(new NodeFixed)
{
    node_->setFixedSize(size);
    node_->setName(name);
}